

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TVP.cpp
# Opt level: O0

void __thiscall MT32Emu::TVP::process(TVP *this)

{
  uint local_18;
  int newResult;
  int rightShifts;
  Bit16s negativeBigTicksRemaining;
  TVP *this_local;
  
  if (this->phase == 0) {
    targetPitchOffsetReached(this);
  }
  else if (this->phase == 5) {
    nextPhase(this);
  }
  else if (this->phase < 8) {
    newResult._2_2_ = (short)(this->timeElapsed >> 8) - this->targetPitchOffsetReachedBigTick;
    if (newResult._2_2_ < 0) {
      local_18 = this->shifts;
      if (0xd < (int)local_18) {
        newResult._2_2_ = (short)((int)newResult._2_2_ >> ((char)local_18 - 0xdU & 0x1f));
        local_18 = 0xd;
      }
      this->currentPitchOffset =
           this->targetPitchOffsetWithoutLFO + (int)this->lfoPitchOffset +
           ((int)newResult._2_2_ * (int)this->pitchOffsetChangePerBigTick >> ((byte)local_18 & 0x1f)
           );
      updatePitch(this);
    }
    else {
      targetPitchOffsetReached(this);
    }
  }
  else {
    updatePitch(this);
  }
  return;
}

Assistant:

void TVP::process() {
	if (phase == 0) {
		targetPitchOffsetReached();
		return;
	}
	if (phase == 5) {
		nextPhase();
		return;
	}
	if (phase > 7) {
		updatePitch();
		return;
	}

	Bit16s negativeBigTicksRemaining = (timeElapsed >> 8) - targetPitchOffsetReachedBigTick;
	if (negativeBigTicksRemaining >= 0) {
		// We've reached the time for a phase change
		targetPitchOffsetReached();
		return;
	}
	// FIXME: Write explanation for this stuff
	// NOTE: Value of shifts may happily exceed the maximum of 31 specified for the 8095 MCU.
	// We assume the device performs a shift with the rightmost 5 bits of the counter regardless of argument size,
	// since shift instructions of any size have the same maximum.
	int rightShifts = shifts;
	if (rightShifts > 13) {
		rightShifts -= 13;
		negativeBigTicksRemaining = negativeBigTicksRemaining >> (rightShifts & 0x1F); // PORTABILITY NOTE: Assumes arithmetic shift
		rightShifts = 13;
	}
	int newResult = (negativeBigTicksRemaining * pitchOffsetChangePerBigTick) >> (rightShifts & 0x1F); // PORTABILITY NOTE: Assumes arithmetic shift
	newResult += targetPitchOffsetWithoutLFO + lfoPitchOffset;
	currentPitchOffset = newResult;
	updatePitch();
}